

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O0

bool __thiscall glslang::HlslGrammar::acceptStructBufferType(HlslGrammar *this,TType *type)

{
  TSpirvType *pTVar1;
  bool bVar2;
  EHlslTokenClass EVar3;
  TType *pTVar4;
  TArraySizes *this_00;
  long lVar5;
  vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *this_01;
  TQualifier *pTVar6;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *s;
  pool_allocator<char> local_1f8;
  TString local_1f0;
  undefined1 local_1c8 [8];
  TType blockType;
  TTypeLoc member;
  TTypeList *blockStruct;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_100;
  TArraySizes *local_d8;
  TArraySizes *unsizedArray;
  TType uintType;
  TType *templateType;
  TBuiltInVariable builtinType;
  TStorageQualifier storage;
  bool readonly;
  bool hasTemplateType;
  EHlslTokenClass structBuffType;
  TType *type_local;
  HlslGrammar *this_local;
  
  pTVar4 = type;
  EVar3 = HlslTokenStream::peek(&this->super_HlslTokenStream);
  bVar2 = true;
  builtinType._2_1_ = EbvNone >> 0x10;
  switch(EVar3) {
  case EHTokAppendStructuredBuffer:
    templateType._0_4_ = 0x96;
    break;
  case EHTokByteAddressBuffer:
    bVar2 = false;
    builtinType._2_1_ = 1;
    templateType._0_4_ = 0x99;
    break;
  case EHTokConsumeStructuredBuffer:
    templateType._0_4_ = 0x96;
    break;
  case EHTokRWByteAddressBuffer:
    bVar2 = false;
    templateType._0_4_ = 0x9a;
    break;
  case EHTokRWStructuredBuffer:
    templateType._0_4_ = 0x97;
    break;
  case EHTokStructuredBuffer:
    templateType._0_4_ = 0x98;
    builtinType._2_1_ = 1;
    break;
  default:
    return false;
  }
  HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
  pTVar4 = (TType *)TType::operator_new((TType *)0x98,(size_t)pTVar4);
  TType::TType(pTVar4,EbtVoid,EvqTemporary,1,0,0,false);
  uintType.spirvType = (TSpirvType *)pTVar4;
  if (bVar2) {
    bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftAngle);
    if (!bVar2) {
      expected(this,"left angle bracket");
      return false;
    }
    bVar2 = acceptType(this,(TType *)uintType.spirvType);
    if (!bVar2) {
      expected(this,"type");
      return false;
    }
    pTVar4 = (TType *)0x176;
    bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightAngle);
    if (!bVar2) {
      expected(this,"right angle bracket");
      return false;
    }
  }
  else {
    TType::TType((TType *)&unsizedArray,EbtUint,EvqBuffer,1,0,0,false);
    pTVar4 = (TType *)&unsizedArray;
    TType::shallowCopy((TType *)uintType.spirvType,pTVar4);
    TType::~TType((TType *)&unsizedArray);
  }
  this_00 = (TArraySizes *)TArraySizes::operator_new((TArraySizes *)0x18,(size_t)pTVar4);
  TArraySizes::TArraySizes(this_00);
  local_d8 = this_00;
  TArraySizes::addInnerSize(this_00,0);
  TType::transferArraySizes((TType *)uintType.spirvType,local_d8);
  lVar5 = (**(code **)&(((uintType.spirvType)->spirvInst).set._M_dataplus.super_allocator_type.
                       allocator)->numCalls)();
  pTVar1 = uintType.spirvType;
  *(ulong *)(lVar5 + 8) = *(ulong *)(lVar5 + 8) & 0xffffffffffffff80 | 6;
  pool_allocator<char>::pool_allocator((pool_allocator<char> *)&blockStruct);
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_100,
             "@data",(pool_allocator<char> *)&blockStruct);
  s = &local_100;
  (*(code *)((pTVar1->spirvInst).set._M_dataplus.super_allocator_type.allocator)->currentPageOffset)
            ();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  ~basic_string(&local_100);
  this_01 = (vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *)
            TVector<glslang::TTypeLoc>::operator_new((TVector<glslang::TTypeLoc> *)0x20,(size_t)s);
  TVector<glslang::TTypeLoc>::TVector((TVector<glslang::TTypeLoc> *)this_01);
  blockType.spirvType = uintType.spirvType;
  std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::push_back
            (this_01,(value_type *)&blockType.spirvType);
  pool_allocator<char>::pool_allocator(&local_1f8);
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_1f0,
             "",&local_1f8);
  pTVar6 = (TQualifier *)
           (**(code **)&(((uintType.spirvType)->spirvInst).set._M_dataplus.super_allocator_type.
                        allocator)->numCalls)();
  TType::TType((TType *)local_1c8,(TTypeList *)this_01,&local_1f0,pTVar6);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  ~basic_string(&local_1f0);
  pTVar6 = TType::getQualifier((TType *)local_1c8);
  *(ulong *)&pTVar6->field_0x8 = *(ulong *)&pTVar6->field_0x8 & 0xffffffffffffff80 | 6;
  pTVar6 = TType::getQualifier((TType *)local_1c8);
  *(ulong *)&pTVar6->field_0x8 =
       *(ulong *)&pTVar6->field_0x8 & 0xffff7fffffffffff | (ulong)(byte)builtinType._2_1_ << 0x2f;
  pTVar6 = TType::getQualifier((TType *)local_1c8);
  *(ulong *)&pTVar6->field_0x8 =
       *(ulong *)&pTVar6->field_0x8 & 0xffffffffffff007f | (ulong)(uint)templateType << 7;
  HlslParseContext::shareStructBufferType(this->parseContext,(TType *)local_1c8);
  TType::shallowCopy(type,(TType *)local_1c8);
  TType::~TType((TType *)local_1c8);
  return true;
}

Assistant:

bool HlslGrammar::acceptStructBufferType(TType& type)
{
    const EHlslTokenClass structBuffType = peek();

    // TODO: globallycoherent
    bool hasTemplateType = true;
    bool readonly = false;

    TStorageQualifier storage = EvqBuffer;
    TBuiltInVariable  builtinType = EbvNone;

    switch (structBuffType) {
    case EHTokAppendStructuredBuffer:
        builtinType = EbvAppendConsume;
        break;
    case EHTokByteAddressBuffer:
        hasTemplateType = false;
        readonly = true;
        builtinType = EbvByteAddressBuffer;
        break;
    case EHTokConsumeStructuredBuffer:
        builtinType = EbvAppendConsume;
        break;
    case EHTokRWByteAddressBuffer:
        hasTemplateType = false;
        builtinType = EbvRWByteAddressBuffer;
        break;
    case EHTokRWStructuredBuffer:
        builtinType = EbvRWStructuredBuffer;
        break;
    case EHTokStructuredBuffer:
        builtinType = EbvStructuredBuffer;
        readonly = true;
        break;
    default:
        return false;  // not a structure buffer type
    }

    advanceToken();  // consume the structure keyword

    // type on which this StructedBuffer is templatized.  E.g, StructedBuffer<MyStruct> ==> MyStruct
    TType* templateType = new TType;

    if (hasTemplateType) {
        if (! acceptTokenClass(EHTokLeftAngle)) {
            expected("left angle bracket");
            return false;
        }
    
        if (! acceptType(*templateType)) {
            expected("type");
            return false;
        }
        if (! acceptTokenClass(EHTokRightAngle)) {
            expected("right angle bracket");
            return false;
        }
    } else {
        // byte address buffers have no explicit type.
        TType uintType(EbtUint, storage);
        templateType->shallowCopy(uintType);
    }

    // Create an unsized array out of that type.
    // TODO: does this work if it's already an array type?
    TArraySizes* unsizedArray = new TArraySizes;
    unsizedArray->addInnerSize(UnsizedArraySize);
    templateType->transferArraySizes(unsizedArray);
    templateType->getQualifier().storage = storage;

    // field name is canonical for all structbuffers
    templateType->setFieldName("@data");

    TTypeList* blockStruct = new TTypeList;
    TTypeLoc  member = { templateType, token.loc };
    blockStruct->push_back(member);

    // This is the type of the buffer block (SSBO)
    TType blockType(blockStruct, "", templateType->getQualifier());

    blockType.getQualifier().storage = storage;
    blockType.getQualifier().readonly = readonly;
    blockType.getQualifier().builtIn = builtinType;

    // We may have created an equivalent type before, in which case we should use its
    // deep structure.
    parseContext.shareStructBufferType(blockType);

    type.shallowCopy(blockType);

    return true;
}